

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adjacency_graph.hpp
# Opt level: O3

span<unsigned_long,_18446744073709551615UL> __thiscall
Disa::Adjacency_Graph<true>::operator[](Adjacency_Graph<true> *this,size_t *i_vertex)

{
  ulong uVar1;
  long lVar2;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  source_location *location;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  span<unsigned_long,_18446744073709551615UL> sVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  size_type *local_e0;
  size_type local_d8;
  size_type local_d0;
  undefined8 uStack_c8;
  string local_c0;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined **local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  location = (source_location *)
             (this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
  lVar2 = (long)(this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)location;
  if ((lVar2 != 0) && (uVar1 = *i_vertex, uVar1 < (lVar2 >> 3) - 1U)) {
    sVar6._M_ptr = (this->vertex_adjacent_list).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start + (long)location[uVar1]._M_impl;
    sVar6._M_extent._M_extent_value =
         (long)location[uVar1 + 1]._M_impl - (long)location[uVar1]._M_impl;
    return sVar6;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
  local_40 = &PTR_s__workspace_llm4binary_github_lic_00176498;
  console_format_abi_cxx11_(&local_38,(Disa *)0x0,(Log_Level)&local_40,location);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,local_38._M_dataplus._M_p,local_38._M_string_length);
  std::__cxx11::to_string(&local_a0,*i_vertex);
  std::operator+(&local_80,"Vertex index ",&local_a0);
  pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_80," not in range [0, ");
  local_100._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
  paVar5 = &pbVar4->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p == paVar5) {
    local_100.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_100.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  }
  else {
    local_100.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
  }
  local_100._M_string_length = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
  pbVar4->_M_string_length = 0;
  (pbVar4->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::to_string(&local_c0,*i_vertex);
  std::operator+(&local_60,&local_100,&local_c0);
  pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_60,").");
  local_e0 = (size_type *)(pbVar4->_M_dataplus)._M_p;
  paVar5 = &pbVar4->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0 == paVar5) {
    local_d0 = paVar5->_M_allocated_capacity;
    uStack_c8 = *(undefined8 *)((long)&pbVar4->field_2 + 8);
    local_e0 = &local_d0;
  }
  else {
    local_d0 = paVar5->_M_allocated_capacity;
  }
  local_d8 = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
  pbVar4->_M_string_length = 0;
  (pbVar4->field_2)._M_local_buf[0] = '\0';
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_e0,local_d8);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_38);
  exit(1);
}

Assistant:

[[nodiscard]] inline std::span<std::size_t> operator[](const std::size_t& i_vertex) {
    ASSERT_DEBUG(i_vertex < size_vertex(),
                 "Vertex index " + std::to_string(i_vertex) + " not in range [0, " + std::to_string(i_vertex) + ").");
    return {vertex_adjacent_list.begin() + static_cast<s_size_t>(offset[i_vertex]),
            offset[i_vertex + 1] - offset[i_vertex]};
  }